

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portaldata.cpp
# Opt level: O3

void Cmd_dumpportals(FCommandLine *argv,APlayerPawn *who,int key)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  undefined8 *puVar5;
  subsector_t *psVar6;
  subsector_t *psVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (portals.Count != 0) {
    uVar13 = 0;
    do {
      dVar1 = (portals.Array[uVar13]->mDisplacement).X;
      dVar2 = (portals.Array[uVar13]->mDisplacement).Y;
      Printf(5,"Portal #%d, %s, displacement = (%f,%f)\n",uVar13 & 0xffffffff);
      Printf(5,"Coverage:\n");
      if (0 < numsubsectors) {
        lVar8 = 0;
        do {
          psVar6 = subsectors;
          if ((subsectors[lVar8].render_sector)->portals[portals.Array[uVar13]->plane] ==
              portals.Array[uVar13]) {
            Printf(5,"\tSubsector %d (%d):\n\t\t",lVar8,
                   (ulong)(uint)(subsectors[lVar8].render_sector)->sectornum);
            if (psVar6[lVar8].numlines != 0) {
              lVar11 = 0;
              uVar9 = 0;
              do {
                pdVar4 = *(double **)((long)&(psVar6[lVar8].firstline)->v1 + lVar11);
                Printf(5,"(%.3f,%.3f), ",*pdVar4 + dVar1,pdVar4[1] + dVar2);
                uVar9 = uVar9 + 1;
                lVar11 = lVar11 + 0x48;
              } while (uVar9 < psVar6[lVar8].numlines);
            }
            Printf(5,"\n\t\tCovered by subsectors:\n");
            iVar3 = portals.Array[uVar13]->plane;
            if (0 < psVar6[lVar8].portalcoverage[iVar3].sscount) {
              lVar11 = 0;
              do {
                psVar7 = subsectors;
                uVar9 = (ulong)psVar6[lVar8].portalcoverage[iVar3].subsectors[lVar11];
                Printf(5,"\t\t\t%5d (%4d): ",uVar9,
                       (ulong)(uint)(subsectors[uVar9].render_sector)->sectornum);
                if (psVar7[uVar9].numlines != 0) {
                  lVar10 = 0;
                  uVar12 = 0;
                  do {
                    puVar5 = *(undefined8 **)((long)&(psVar7[uVar9].firstline)->v1 + lVar10);
                    Printf(5,"(%.3f,%.3f), ",*puVar5,puVar5[1]);
                    uVar12 = uVar12 + 1;
                    lVar10 = lVar10 + 0x48;
                  } while (uVar12 < psVar7[uVar9].numlines);
                }
                Printf(5,"\n");
                lVar11 = lVar11 + 1;
              } while (lVar11 < psVar6[lVar8].portalcoverage[iVar3].sscount);
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < numsubsectors);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < portals.Count);
  }
  return;
}

Assistant:

CCMD(dumpportals)
{
	for(unsigned i=0;i<portals.Size(); i++)
	{
		double xdisp = portals[i]->mDisplacement.X;
		double ydisp = portals[i]->mDisplacement.Y;
		Printf(PRINT_LOG, "Portal #%d, %s, displacement = (%f,%f)\n", i, portals[i]->plane==0? "floor":"ceiling",
			xdisp, ydisp);
		Printf(PRINT_LOG, "Coverage:\n");
		for(int j=0;j<numsubsectors;j++)
		{
			subsector_t *sub = &subsectors[j];
			FPortal *port = sub->render_sector->GetGLPortal(portals[i]->plane);
			if (port == portals[i])
			{
				Printf(PRINT_LOG, "\tSubsector %d (%d):\n\t\t", j, sub->render_sector->sectornum);
				for(unsigned k = 0;k< sub->numlines; k++)
				{
					Printf(PRINT_LOG, "(%.3f,%.3f), ",	sub->firstline[k].v1->fX() + xdisp, sub->firstline[k].v1->fY() + ydisp);
				}
				Printf(PRINT_LOG, "\n\t\tCovered by subsectors:\n");
				FPortalCoverage *cov = &sub->portalcoverage[portals[i]->plane];
				for(int l = 0;l< cov->sscount; l++)
				{
					subsector_t *csub = &subsectors[cov->subsectors[l]];
					Printf(PRINT_LOG, "\t\t\t%5d (%4d): ", cov->subsectors[l], csub->render_sector->sectornum);
					for(unsigned m = 0;m< csub->numlines; m++)
					{
						Printf(PRINT_LOG, "(%.3f,%.3f), ",	csub->firstline[m].v1->fX(), csub->firstline[m].v1->fY());
					}
					Printf(PRINT_LOG, "\n");
				}
			}
		}
	}
}